

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Glucose::Solver::attachClause(Solver *this,CRef cr)

{
  long *plVar1;
  uint *puVar2;
  vec<Glucose::Solver::Watcher> *this_00;
  Watcher local_30;
  
  puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  local_30.cref = cr;
  if (puVar2[(ulong)cr + 1] == 2) {
    local_30.blocker.x = puVar2[(ulong)cr + 4];
    vec<Glucose::Solver::Watcher>::push
              ((this->watchesBin).occs.data + ((long)(int)puVar2[(ulong)cr + 3] ^ 1U),&local_30);
    this_00 = (this->watchesBin).occs.data + ((long)(int)puVar2[(ulong)cr + 4] ^ 1);
  }
  else {
    local_30.blocker.x = puVar2[(ulong)cr + 4];
    vec<Glucose::Solver::Watcher>::push
              ((this->watches).occs.data + ((long)(int)puVar2[(ulong)cr + 3] ^ 1U),&local_30);
    this_00 = (this->watches).occs.data + ((long)(int)puVar2[(ulong)cr + 4] ^ 1);
  }
  local_30.blocker.x = puVar2[(ulong)cr + 3];
  local_30.cref = cr;
  vec<Glucose::Solver::Watcher>::push(this_00,&local_30);
  plVar1 = (long *)((long)(this->stats).data + (ulong)((uint)*(long *)(puVar2 + cr) & 4) * 2 + 0x98)
  ;
  *plVar1 = *plVar1 + (*(long *)(puVar2 + cr) >> 0x20);
  return;
}

Assistant:

void Solver::attachClause(CRef cr) {
    const Clause &c = ca[cr];

    assert(c.size() > 1);
    if(c.size() == 2) {
        watchesBin[~c[0]].push(Watcher(cr, c[1]));
        watchesBin[~c[1]].push(Watcher(cr, c[0]));
    } else {
        watches[~c[0]].push(Watcher(cr, c[1]));
        watches[~c[1]].push(Watcher(cr, c[0]));
    }
    if(c.learnt()) stats[learnts_literals] += c.size();
    else stats[clauses_literals] += c.size();
}